

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  st_ptls_esni_secret_t **esni;
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ptls_key_schedule_t *ppVar4;
  ptls_context_t *ppVar5;
  st_ptls_update_esni_key_t *psVar6;
  size_t *psVar7;
  ptls_buffer_t *buf;
  ptls_buffer_t *buf_00;
  st_ptls_key_exchange_algorithm_t *psVar8;
  ptls_iovec_t *ppVar9;
  ptls_key_exchange_algorithm_t *ppVar10;
  ptls_hash_algorithm_t *algo;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ptls_iovec_t hash_value;
  ptls_iovec_t pVar14;
  int iVar15;
  uint uVar16;
  st_ptls_esni_secret_t *psVar17;
  ptls_cipher_suite_t **pppVar18;
  ptls_hash_context_t *ppVar19;
  ulong uVar20;
  uint8_t *puVar21;
  size_t sVar22;
  ptls_key_schedule_t *ppVar23;
  uint64_t uVar24;
  ptls_key_exchange_context_t **pppVar25;
  size_t sVar26;
  ptls_cipher_suite_t *ppVar27;
  size_t sVar28;
  char *server_name;
  long lVar29;
  ptls_key_exchange_algorithm_t **pppVar30;
  ushort *puVar31;
  size_t sVar32;
  ushort *end;
  long lVar33;
  int ret;
  uint8_t *puVar34;
  uint8_t *in_R9;
  ushort *puVar35;
  ptls_early_data_acceptance_t pVar36;
  ptls_hash_context_t **pppVar37;
  uint16_t *puVar38;
  uint16_t uVar39;
  ulong uVar40;
  size_t sVar41;
  ushort *puVar42;
  size_t sVar43;
  bool bVar44;
  ptls_iovec_t secret;
  ptls_iovec_t ikm;
  ptls_iovec_t esni_keys;
  size_t local_120;
  uint32_t _v;
  ushort *local_108;
  ushort *local_e0;
  ptls_iovec_t *local_d8;
  size_t local_d0;
  ptls_cipher_suite_t **local_c8;
  ptls_key_exchange_context_t **local_c0;
  size_t local_b8;
  size_t local_b0;
  uint8_t *local_a8;
  uint64_t not_before;
  uint32_t max_early_data_size;
  uint32_t age_add;
  ptls_iovec_t resumption_ticket;
  uint64_t not_after;
  uint8_t binder_key [64];
  
  ppVar4 = tls->key_schedule;
  if (tls->server_name == (char *)0x0) {
    bVar44 = false;
  }
  else {
    iVar15 = ptls_server_name_is_ipaddr(tls->server_name);
    bVar44 = iVar15 == 0;
  }
  if (properties != (ptls_handshake_properties_t *)0x0) {
    if (((bool)(ppVar4 == (ptls_key_schedule_t *)0x0 & bVar44)) &&
       (puVar42 = (ushort *)(properties->field_0).client.esni_keys.base, puVar42 != (ushort *)0x0))
    {
      ppVar5 = tls->ctx;
      uVar40 = (properties->field_0).client.esni_keys.len;
      psVar17 = (st_ptls_esni_secret_t *)calloc(1,200);
      tls->esni = psVar17;
      if (psVar17 == (st_ptls_esni_secret_t *)0x0) {
        iVar15 = 0x201;
        goto LAB_00113a07;
      }
      esni = &tls->esni;
      if (((1 < (long)uVar40) && ((ushort)(*puVar42 << 8 | *puVar42 >> 8) == 0xff01)) &&
         (5 < uVar40)) {
        pppVar18 = ppVar5->cipher_suites;
        ppVar27 = *pppVar18;
        if (ppVar27 != (ptls_cipher_suite_t *)0x0) {
          local_a8 = tls->client_random;
          local_c8 = (ptls_cipher_suite_t **)((long)&psVar17->field_3 + 8);
          end = (ushort *)((long)puVar42 + uVar40);
          do {
            pppVar18 = pppVar18 + 1;
            if ((ppVar27->id | 2) == 0x1303) {
              ppVar19 = (*ppVar27->hash->create)();
              if (ppVar19 != (ptls_hash_context_t *)0x0) {
                (*ppVar19->update)(ppVar19,puVar42,2);
                (*ppVar19->update)(ppVar19,"",4);
                local_d8 = (ptls_iovec_t *)(uVar40 - 6);
                (*ppVar19->update)(ppVar19,puVar42 + 3);
                (*ppVar19->final)(ppVar19,binder_key,PTLS_HASH_FINAL_MODE_FREE);
                if ((*(int *)(puVar42 + 1) == binder_key._0_4_) && ((ptls_iovec_t *)0x1 < local_d8))
                {
                  uVar20 = (ulong)(ushort)(puVar42[3] << 8 | puVar42[3] >> 8);
                  local_e0 = puVar42 + 4;
                  if (uVar20 <= uVar40 - 8) {
                    puVar35 = (ushort *)((long)local_e0 + uVar20);
                    in_R9 = (uint8_t *)0x0;
                    iVar15 = select_key_share((ptls_key_exchange_algorithm_t **)&psVar17->field_3,
                                              &resumption_ticket,ppVar5->key_exchanges,
                                              (uint8_t **)&local_e0,(uint8_t *)puVar35,0);
                    if (((iVar15 == 0) && (local_e0 == puVar35)) &&
                       (1 < (ulong)((long)end - (long)puVar35))) {
                      uVar20 = (ulong)(ushort)(*local_e0 << 8 | *local_e0 >> 8);
                      puVar35 = local_e0 + 1;
                      if (uVar20 <= (ulong)((long)end - (long)puVar35)) {
                        puVar31 = (ushort *)(uVar20 + (long)puVar35);
                        iVar15 = select_cipher(local_c8,ppVar5->cipher_suites,(uint8_t *)puVar35,
                                               (uint8_t *)puVar31);
                        if ((iVar15 == 0) && (1 < (long)end - (long)puVar31)) {
                          (psVar17->field_3).client.padded_length = *puVar31 << 8 | *puVar31 >> 8;
                          local_e0 = puVar31 + 1;
                          iVar15 = ptls_decode64(&not_before,(uint8_t **)&local_e0,(uint8_t *)end);
                          if ((iVar15 == 0) &&
                             ((iVar15 = ptls_decode64(&not_after,(uint8_t **)&local_e0,
                                                      (uint8_t *)end), iVar15 == 0 &&
                              (1 < (ulong)((long)end - (long)local_e0))))) {
                            uVar20 = (ulong)(ushort)(*local_e0 << 8 | *local_e0 >> 8);
                            puVar35 = local_e0 + 1;
                            if (uVar20 <= (ulong)((long)end - (long)puVar35)) {
                              puVar31 = puVar35;
                              if (uVar20 == 0) goto LAB_00113d39;
                              puVar31 = (ushort *)(uVar20 + (long)puVar35);
                              goto LAB_00113cef;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              break;
            }
            ppVar27 = *pppVar18;
          } while (ppVar27 != (ptls_cipher_suite_t *)0x0);
        }
      }
      goto LAB_001133b1;
    }
    goto LAB_00113406;
  }
  uVar16 = 0;
  uVar40 = 0;
  local_108 = (ushort *)0x0;
  if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) goto LAB_0011351f;
  goto LAB_00113530;
joined_r0x00113b06:
  if (ppVar27 == (ptls_cipher_suite_t *)0x0) goto LAB_001134ad;
  pppVar18 = pppVar18 + 1;
  if (ppVar27->id == (uint16_t)(uVar3 << 8 | uVar3 >> 8)) {
    uVar24 = (*ppVar5->get_time->cb)(ppVar5->get_time);
    if ((not_before <= uVar24) && (uVar24 - not_before < 0x240c8400)) {
      bVar1 = (tls->field_20).server.pending_traffic_secret[0x28];
      uVar16 = (int)(uVar24 - not_before) + age_add;
      (tls->field_20).server.pending_traffic_secret[0x28] = bVar1 | 1;
      if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
        tls->key_share = ppVar10;
      }
      tls->cipher_suite = ppVar27;
      if ((max_early_data_size != 0 && ppVar4 == (ptls_key_schedule_t *)0x0) &&
         ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
        (tls->field_20).server.pending_traffic_secret[0x28] = bVar1 | 3;
        *(properties->field_0).client.max_early_data_size = (ulong)max_early_data_size;
      }
      goto LAB_001134e5;
    }
    goto LAB_001134ad;
  }
  ppVar27 = *pppVar18;
  goto joined_r0x00113b06;
  while( true ) {
    uVar20 = (ulong)(ushort)(puVar35[1] << 8 | puVar35[1] >> 8);
    if ((ulong)((long)puVar31 - (long)(puVar35 + 2)) < uVar20) goto LAB_001133b1;
    puVar35 = (ushort *)((long)(puVar35 + 2) + uVar20);
    if (puVar35 == puVar31) break;
LAB_00113cef:
    if (((long)puVar31 - (long)puVar35 < 2) || (((long)puVar31 - (long)puVar35) - 2U < 2))
    goto LAB_001133b1;
  }
LAB_00113d39:
  if (puVar31 == end) {
    uVar24 = (*ppVar5->get_time->cb)(ppVar5->get_time);
    if ((uVar24 / 1000 < not_before) || (not_after < uVar24 / 1000)) goto LAB_001133b1;
    (*ppVar5->random_bytes)((*esni)->nonce,0x10);
    psVar17 = *esni;
    ppVar19 = (*((psVar17->field_3).client.cipher)->hash->create)();
    if (ppVar19 == (ptls_hash_context_t *)0x0) {
      iVar15 = 0x201;
LAB_00114a25:
      free_esni_secret(esni,0);
      goto LAB_00113a07;
    }
    (*ppVar19->update)(ppVar19,puVar42,uVar40);
    (*ppVar19->final)(ppVar19,(void *)((long)&psVar17->field_3 + 0x20),PTLS_HASH_FINAL_MODE_FREE);
    psVar17 = *esni;
    psVar8 = (psVar17->field_3).client.key_share;
    pVar14.len = resumption_ticket.len;
    pVar14.base = resumption_ticket.base;
    iVar15 = (*psVar8->exchange)(psVar8,&(psVar17->field_3).client.pubkey,&psVar17->secret,pVar14);
    if (iVar15 != 0) goto LAB_00114a25;
    psVar17 = *esni;
    in_R9 = (uint8_t *)(psVar17->field_3).client.pubkey.len;
    iVar15 = build_esni_contents_hash
                       (((psVar17->field_3).client.cipher)->hash,psVar17->esni_contents_hash,
                        (psVar17->field_3).client.record_digest,
                        ((psVar17->field_3).client.key_share)->id,(psVar17->field_3).client.pubkey,
                        local_a8);
    if (iVar15 != 0) goto LAB_00114a25;
  }
  else {
LAB_001133b1:
    free(*esni);
    *esni = (st_ptls_esni_secret_t *)0x0;
  }
  psVar6 = tls->ctx->update_esni_key;
  if (psVar6 != (st_ptls_update_esni_key_t *)0x0) {
    psVar17 = tls->esni;
    in_R9 = psVar17->esni_contents_hash;
    iVar15 = (*psVar6->cb)(psVar6,tls,psVar17->secret,((psVar17->field_3).client.cipher)->hash,in_R9
                          );
    if (iVar15 != 0) goto LAB_00113a07;
  }
LAB_00113406:
  puVar42 = (ushort *)(properties->field_0).client.session_ticket.base;
  pVar36 = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
  if (puVar42 == (ushort *)0x0) {
    uVar16 = 0;
    uVar40 = 0;
    local_108 = (ushort *)0x0;
  }
  else {
    puVar34 = (uint8_t *)((properties->field_0).client.session_ticket.len + (long)puVar42);
    local_e0 = puVar42;
    iVar15 = ptls_decode64(&not_before,(uint8_t **)&local_e0,puVar34);
    if ((((iVar15 == 0) && (1 < (long)puVar34 - (long)local_e0)) &&
        (1 < ((long)puVar34 - (long)local_e0) + -2)) &&
       (2 < (ulong)((long)puVar34 - (long)(local_e0 + 2)))) {
      uVar2 = *local_e0;
      uVar3 = local_e0[1];
      lVar33 = 0;
      uVar40 = 0;
      do {
        uVar40 = (ulong)*(byte *)((long)(local_e0 + 2) + lVar33) | uVar40 << 8;
        lVar33 = lVar33 + 1;
      } while (lVar33 != 3);
      puVar21 = (uint8_t *)((long)local_e0 + 7);
      if (uVar40 <= (ulong)((long)puVar34 - (long)puVar21)) {
        puVar42 = (ushort *)(puVar21 + uVar40);
        in_R9 = (uint8_t *)&max_early_data_size;
        iVar15 = decode_new_session_ticket
                           (tls,(uint32_t *)&not_after,&age_add,(ptls_iovec_t *)binder_key,
                            &resumption_ticket,(uint32_t *)in_R9,puVar21,(uint8_t *)puVar42);
        if ((1 < (ulong)((long)puVar34 - (long)puVar42)) && (iVar15 == 0)) {
          uVar40 = (ulong)(ushort)(*puVar42 << 8 | *puVar42 >> 8);
          local_108 = puVar42 + 1;
          if ((uint8_t *)((long)puVar42 + uVar40 + 2) == puVar34 &&
              uVar40 <= (ulong)((long)puVar34 - (long)local_108)) {
            ppVar5 = tls->ctx;
            pppVar30 = ppVar5->key_exchanges;
            ppVar10 = *pppVar30;
            while (ppVar10 != (ptls_key_exchange_algorithm_t *)0x0) {
              pppVar30 = pppVar30 + 1;
              if (ppVar10->id == (uint16_t)(uVar2 << 8 | uVar2 >> 8)) {
                pppVar18 = ppVar5->cipher_suites;
                ppVar27 = *pppVar18;
                goto joined_r0x00113b06;
              }
              ppVar10 = *pppVar30;
            }
          }
        }
      }
    }
LAB_001134ad:
    uVar16 = 0;
    uVar40 = 0;
    local_108 = (ushort *)0x0;
  }
LAB_001134e5:
  if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) == 0) {
    psVar7 = (properties->field_0).client.max_early_data_size;
    pVar36 = PTLS_EARLY_DATA_REJECTED;
    if (psVar7 != (size_t *)0x0) {
      *psVar7 = 0;
    }
  }
  (properties->field_0).client.early_data_acceptance = pVar36;
  if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) &&
     (((properties->field_0).server.selected_psk_binder.base[0x2c] & 1) == 0)) {
LAB_0011351f:
    tls->key_share = *tls->ctx->key_exchanges;
  }
LAB_00113530:
  if (ppVar4 == (ptls_key_schedule_t *)0x0) {
    ppVar23 = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                               tls->ctx->hkdf_label_prefix__obsolete);
    tls->key_schedule = ppVar23;
    ikm.len = uVar40;
    ikm.base = (uint8_t *)local_108;
    iVar15 = key_schedule_extract(ppVar23,ikm);
    if (iVar15 != 0) goto LAB_00113a07;
  }
  lVar33 = emitter->record_header_length + emitter->buf->off;
  iVar15 = (*emitter->begin_message)(emitter);
  if (iVar15 != 0) goto LAB_00113a07;
  buf = emitter->buf;
  iVar15 = ptls_buffer_reserve(buf,1);
  if (iVar15 != 0) goto LAB_00113a07;
  buf->base[buf->off] = '\x01';
  buf->off = buf->off + 1;
  iVar15 = ptls_buffer_reserve(buf,3);
  if (iVar15 != 0) goto LAB_00113a07;
  puVar34 = buf->base;
  sVar22 = buf->off;
  puVar34[sVar22 + 2] = '\0';
  puVar34 = puVar34 + sVar22;
  puVar34[0] = '\0';
  puVar34[1] = '\0';
  local_c8 = (ptls_cipher_suite_t **)buf->off;
  puVar34 = (uint8_t *)((long)local_c8 + 3);
  buf->off = (size_t)puVar34;
  buf_00 = emitter->buf;
  iVar15 = ptls_buffer_reserve(buf_00,2);
  if (iVar15 != 0) goto LAB_00113a07;
  puVar21 = buf_00->base;
  sVar22 = buf_00->off;
  (puVar21 + sVar22)[0] = '\x03';
  (puVar21 + sVar22)[1] = '\x03';
  buf_00->off = buf_00->off + 2;
  local_a8 = puVar34;
  iVar15 = ptls_buffer_reserve(buf_00,0x20);
  if (iVar15 != 0) goto LAB_00113a07;
  puVar34 = buf_00->base;
  sVar22 = buf_00->off;
  uVar11 = *(undefined8 *)tls->client_random;
  uVar12 = *(undefined8 *)(tls->client_random + 8);
  uVar13 = *(undefined8 *)(tls->client_random + 0x18);
  puVar21 = puVar34 + sVar22 + 0x10;
  *(undefined8 *)puVar21 = *(undefined8 *)(tls->client_random + 0x10);
  *(undefined8 *)(puVar21 + 8) = uVar13;
  puVar34 = puVar34 + sVar22;
  *(undefined8 *)puVar34 = uVar11;
  *(undefined8 *)(puVar34 + 8) = uVar12;
  buf_00->off = buf_00->off + 0x20;
  iVar15 = ptls_buffer_reserve(buf_00,1);
  if (iVar15 != 0) goto LAB_00113a07;
  buf_00->base[buf_00->off] = '\0';
  sVar22 = buf_00->off;
  sVar41 = sVar22 + 1;
  buf_00->off = sVar41;
  local_d8 = cookie;
  iVar15 = ptls_buffer_reserve(buf_00,0x20);
  if (iVar15 != 0) goto LAB_00113a07;
  puVar34 = buf_00->base;
  sVar28 = buf_00->off;
  uVar11 = *(undefined8 *)&tls->field_20;
  uVar12 = *(undefined8 *)((long)&tls->field_20 + 8);
  uVar13 = *(undefined8 *)((long)&tls->field_20 + 0x18);
  puVar21 = puVar34 + sVar28 + 0x10;
  *(undefined8 *)puVar21 = *(undefined8 *)((long)&tls->field_20 + 0x10);
  *(undefined8 *)(puVar21 + 8) = uVar13;
  puVar34 = puVar34 + sVar28;
  *(undefined8 *)puVar34 = uVar11;
  *(undefined8 *)(puVar34 + 8) = uVar12;
  sVar28 = buf_00->off + 0x20;
  buf_00->off = sVar28;
  buf_00->base[sVar22] = (char)sVar28 - (char)sVar41;
  iVar15 = ptls_buffer_reserve(buf_00,2);
  if (iVar15 != 0) goto LAB_00113a07;
  puVar34 = buf_00->base;
  sVar22 = buf_00->off;
  (puVar34 + sVar22)[0] = '\0';
  (puVar34 + sVar22)[1] = '\0';
  local_b0 = buf_00->off;
  sVar22 = local_b0 + 2;
  buf_00->off = sVar22;
  pppVar18 = tls->ctx->cipher_suites;
  ppVar27 = *pppVar18;
  local_b8 = sVar22;
  while (ppVar27 != (ptls_cipher_suite_t *)0x0) {
    pppVar18 = pppVar18 + 1;
    uVar2 = ppVar27->id;
    iVar15 = ptls_buffer_reserve(buf_00,2);
    if (iVar15 != 0) goto LAB_00113a07;
    *(ushort *)(buf_00->base + buf_00->off) = uVar2 << 8 | uVar2 >> 8;
    sVar22 = buf_00->off + 2;
    buf_00->off = sVar22;
    ppVar27 = *pppVar18;
  }
  buf_00->base[local_b0] = (uint8_t)(sVar22 - local_b8 >> 8);
  buf_00->base[local_b0 + 1] = (uint8_t)(sVar22 - local_b8);
  iVar15 = ptls_buffer_reserve(buf_00,1);
  if (iVar15 != 0) goto LAB_00113a07;
  buf_00->base[buf_00->off] = '\0';
  sVar22 = buf_00->off;
  buf_00->off = sVar22 + 1;
  iVar15 = ptls_buffer_reserve(buf_00,1);
  if (iVar15 != 0) goto LAB_00113a07;
  buf_00->base[buf_00->off] = '\0';
  sVar41 = buf_00->off;
  buf_00->off = sVar41 + 1;
  buf_00->base[sVar22] = (char)sVar41 - (char)sVar22;
  iVar15 = ptls_buffer_reserve(buf_00,2);
  if (iVar15 != 0) goto LAB_00113a07;
  puVar34 = buf_00->base;
  sVar22 = buf_00->off;
  (puVar34 + sVar22)[0] = '\0';
  (puVar34 + sVar22)[1] = '\0';
  local_b0 = buf_00->off;
  local_b8 = local_b0 + 2;
  buf_00->off = local_b8;
  iVar15 = ptls_buffer_reserve(buf_00,2);
  if (iVar15 != 0) goto LAB_00113a07;
  puVar34 = buf_00->base;
  sVar22 = buf_00->off;
  (puVar34 + sVar22)[0] = '\0';
  (puVar34 + sVar22)[1] = '3';
  buf_00->off = buf_00->off + 2;
  iVar15 = ptls_buffer_reserve(buf_00,2);
  if (iVar15 != 0) goto LAB_00113a07;
  puVar34 = buf_00->base;
  sVar22 = buf_00->off;
  (puVar34 + sVar22)[0] = '\0';
  (puVar34 + sVar22)[1] = '\0';
  sVar22 = buf_00->off;
  sVar41 = sVar22 + 2;
  buf_00->off = sVar41;
  iVar15 = ptls_buffer_reserve(buf_00,2);
  if (iVar15 != 0) goto LAB_00113a07;
  puVar34 = buf_00->base;
  sVar28 = buf_00->off;
  (puVar34 + sVar28)[0] = '\0';
  (puVar34 + sVar28)[1] = '\0';
  local_d0 = buf_00->off;
  sVar28 = local_d0 + 2;
  buf_00->off = sVar28;
  psVar8 = tls->key_share;
  sVar26 = sVar28;
  if (psVar8 != (st_ptls_key_exchange_algorithm_t *)0x0) {
    local_c0 = &(tls->field_20).client.key_share_ctx;
    iVar15 = (*psVar8->create)(psVar8,local_c0);
    if ((iVar15 != 0) ||
       (iVar15 = push_key_share_entry(buf_00,tls->key_share->id,(*local_c0)->pubkey), iVar15 != 0))
    goto LAB_00113a07;
    sVar26 = buf_00->off;
  }
  buf_00->base[local_d0] = (uint8_t)(sVar26 - sVar28 >> 8);
  buf_00->base[local_d0 + 1] = (uint8_t)(sVar26 - sVar28);
  server_name = (char *)(buf_00->off - sVar41);
  buf_00->base[sVar22] = (uint8_t)((ulong)server_name >> 8);
  buf_00->base[sVar22 + 1] = (uint8_t)server_name;
  if (bVar44) {
    psVar17 = tls->esni;
    iVar15 = ptls_buffer_reserve(buf_00,2);
    if (psVar17 == (st_ptls_esni_secret_t *)0x0) {
      if (iVar15 != 0) goto LAB_00113a07;
      puVar34 = buf_00->base;
      sVar22 = buf_00->off;
      (puVar34 + sVar22)[0] = '\0';
      (puVar34 + sVar22)[1] = '\0';
      buf_00->off = buf_00->off + 2;
      iVar15 = ptls_buffer_reserve(buf_00,2);
      if (iVar15 != 0) goto LAB_00113a07;
      puVar34 = buf_00->base;
      sVar22 = buf_00->off;
      (puVar34 + sVar22)[0] = '\0';
      (puVar34 + sVar22)[1] = '\0';
      sVar22 = buf_00->off;
      buf_00->off = sVar22 + 2;
      iVar15 = emit_server_name_extension(buf_00,tls->server_name);
      if (iVar15 != 0) goto LAB_00113a07;
      lVar29 = buf_00->off - (sVar22 + 2);
      buf_00->base[sVar22] = (uint8_t)((ulong)lVar29 >> 8);
      buf_00->base[sVar22 + 1] = (uint8_t)lVar29;
      goto LAB_00113ece;
    }
    if (iVar15 != 0) goto LAB_00113a07;
    puVar34 = buf_00->base;
    sVar22 = buf_00->off;
    (puVar34 + sVar22)[0] = 0xff;
    (puVar34 + sVar22)[1] = 0xce;
    buf_00->off = buf_00->off + 2;
    iVar15 = ptls_buffer_reserve(buf_00,2);
    if (iVar15 != 0) goto LAB_00113a07;
    puVar34 = buf_00->base;
    sVar22 = buf_00->off;
    (puVar34 + sVar22)[0] = '\0';
    (puVar34 + sVar22)[1] = '\0';
    sVar22 = buf_00->off;
    buf_00->off = sVar22 + 2;
    esni_keys.len = sVar41;
    esni_keys.base = (uint8_t *)tls->server_name;
    iVar15 = emit_esni_extension(tls->esni,buf_00,esni_keys,server_name,(size_t)in_R9,
                                 (size_t)properties);
    if (iVar15 != 0) goto LAB_00113a07;
    lVar29 = buf_00->off - (sVar22 + 2);
    buf_00->base[sVar22] = (uint8_t)((ulong)lVar29 >> 8);
    buf_00->base[sVar22 + 1] = (uint8_t)lVar29;
LAB_00113ed9:
    if ((properties->field_0).client.negotiated_protocols.count != 0) {
      iVar15 = ptls_buffer_reserve(buf_00,2);
      if (iVar15 != 0) goto LAB_00113a07;
      puVar34 = buf_00->base;
      sVar22 = buf_00->off;
      (puVar34 + sVar22)[0] = '\0';
      (puVar34 + sVar22)[1] = '\x10';
      buf_00->off = buf_00->off + 2;
      iVar15 = ptls_buffer_reserve(buf_00,2);
      if (iVar15 != 0) goto LAB_00113a07;
      puVar34 = buf_00->base;
      sVar22 = buf_00->off;
      (puVar34 + sVar22)[0] = '\0';
      (puVar34 + sVar22)[1] = '\0';
      sVar22 = buf_00->off;
      buf_00->off = sVar22 + 2;
      iVar15 = ptls_buffer_reserve(buf_00,2);
      if (iVar15 != 0) goto LAB_00113a07;
      puVar34 = buf_00->base;
      sVar41 = buf_00->off;
      (puVar34 + sVar41)[0] = '\0';
      (puVar34 + sVar41)[1] = '\0';
      local_d0 = buf_00->off;
      pppVar25 = (ptls_key_exchange_context_t **)(local_d0 + 2);
      buf_00->off = (size_t)pppVar25;
      local_c0 = pppVar25;
      if ((properties->field_0).client.negotiated_protocols.count != 0) {
        lVar29 = 8;
        local_120 = 0;
        do {
          iVar15 = ptls_buffer_reserve(buf_00,1);
          if (iVar15 != 0) goto LAB_00113a07;
          buf_00->base[buf_00->off] = '\0';
          sVar41 = buf_00->off;
          sVar28 = sVar41 + 1;
          buf_00->off = sVar28;
          ppVar9 = (properties->field_0).client.negotiated_protocols.list;
          iVar15 = ptls_buffer__do_pushv
                             (buf_00,*(void **)((long)ppVar9 + lVar29 + -8),
                              *(size_t *)((long)&ppVar9->base + lVar29));
          if (iVar15 != 0) goto LAB_00113a07;
          buf_00->base[sVar41] = (char)(int)buf_00->off - (char)sVar28;
          local_120 = local_120 + 1;
          lVar29 = lVar29 + 0x10;
        } while (local_120 != (properties->field_0).client.negotiated_protocols.count);
        pppVar25 = (ptls_key_exchange_context_t **)buf_00->off;
      }
      buf_00->base[local_d0] = (uint8_t)((ulong)((long)pppVar25 - (long)local_c0) >> 8);
      buf_00->base[local_d0 + 1] = (uint8_t)((long)pppVar25 - (long)local_c0);
      lVar29 = buf_00->off - (sVar22 + 2);
      buf_00->base[sVar22] = (uint8_t)((ulong)lVar29 >> 8);
      buf_00->base[sVar22 + 1] = (uint8_t)lVar29;
    }
  }
  else {
LAB_00113ece:
    if (properties != (ptls_handshake_properties_t *)0x0) goto LAB_00113ed9;
  }
  if (tls->ctx->decompress_certificate != (ptls_decompress_certificate_t *)0x0) {
    iVar15 = ptls_buffer_reserve(buf_00,2);
    if (iVar15 != 0) goto LAB_00113a07;
    puVar34 = buf_00->base;
    sVar22 = buf_00->off;
    (puVar34 + sVar22)[0] = '\0';
    (puVar34 + sVar22)[1] = '\x1b';
    buf_00->off = buf_00->off + 2;
    iVar15 = ptls_buffer_reserve(buf_00,2);
    if (iVar15 != 0) goto LAB_00113a07;
    puVar34 = buf_00->base;
    sVar22 = buf_00->off;
    (puVar34 + sVar22)[0] = '\0';
    (puVar34 + sVar22)[1] = '\0';
    sVar22 = buf_00->off;
    buf_00->off = sVar22 + 2;
    iVar15 = ptls_buffer_reserve(buf_00,1);
    if (iVar15 != 0) goto LAB_00113a07;
    buf_00->base[buf_00->off] = '\0';
    sVar41 = buf_00->off;
    sVar28 = sVar41 + 1;
    buf_00->off = sVar28;
    puVar38 = tls->ctx->decompress_certificate->supported_algorithms;
    uVar39 = *puVar38;
    if (uVar39 == 0xffff) {
      __assert_fail("*algo != UINT16_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                    ,0x796,
                    "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                   );
    }
    do {
      puVar38 = puVar38 + 1;
      iVar15 = ptls_buffer_reserve(buf_00,2);
      if (iVar15 != 0) goto LAB_00113a07;
      *(uint16_t *)(buf_00->base + buf_00->off) = uVar39 << 8 | uVar39 >> 8;
      sVar26 = buf_00->off + 2;
      buf_00->off = sVar26;
      uVar39 = *puVar38;
    } while (uVar39 != 0xffff);
    buf_00->base[sVar41] = (char)sVar26 - (char)sVar28;
    lVar29 = buf_00->off - (sVar22 + 2);
    buf_00->base[sVar22] = (uint8_t)((ulong)lVar29 >> 8);
    buf_00->base[sVar22 + 1] = (uint8_t)lVar29;
  }
  iVar15 = ptls_buffer_reserve(buf_00,2);
  if (iVar15 == 0) {
    puVar34 = buf_00->base;
    sVar22 = buf_00->off;
    (puVar34 + sVar22)[0] = '\0';
    (puVar34 + sVar22)[1] = '+';
    buf_00->off = buf_00->off + 2;
    iVar15 = ptls_buffer_reserve(buf_00,2);
    if (iVar15 == 0) {
      puVar34 = buf_00->base;
      sVar22 = buf_00->off;
      (puVar34 + sVar22)[0] = '\0';
      (puVar34 + sVar22)[1] = '\0';
      sVar22 = buf_00->off;
      buf_00->off = sVar22 + 2;
      iVar15 = ptls_buffer_reserve(buf_00,1);
      if (iVar15 == 0) {
        buf_00->base[buf_00->off] = '\0';
        sVar41 = buf_00->off;
        sVar28 = sVar41 + 1;
        buf_00->off = sVar28;
        lVar29 = 0;
        do {
          uVar2 = *(ushort *)((long)supported_versions + lVar29);
          iVar15 = ptls_buffer_reserve(buf_00,2);
          if (iVar15 != 0) goto LAB_00113a07;
          *(ushort *)(buf_00->base + buf_00->off) = uVar2 << 8 | uVar2 >> 8;
          sVar26 = buf_00->off + 2;
          buf_00->off = sVar26;
          lVar29 = lVar29 + 2;
        } while (lVar29 != 8);
        buf_00->base[sVar41] = (char)sVar26 - (char)sVar28;
        lVar29 = buf_00->off - (sVar22 + 2);
        buf_00->base[sVar22] = (uint8_t)((ulong)lVar29 >> 8);
        buf_00->base[sVar22 + 1] = (uint8_t)lVar29;
        iVar15 = ptls_buffer_reserve(buf_00,2);
        if (iVar15 == 0) {
          puVar34 = buf_00->base;
          sVar22 = buf_00->off;
          (puVar34 + sVar22)[0] = '\0';
          (puVar34 + sVar22)[1] = '\r';
          buf_00->off = buf_00->off + 2;
          iVar15 = ptls_buffer_reserve(buf_00,2);
          if (iVar15 == 0) {
            puVar34 = buf_00->base;
            sVar22 = buf_00->off;
            (puVar34 + sVar22)[0] = '\0';
            (puVar34 + sVar22)[1] = '\0';
            sVar22 = buf_00->off;
            buf_00->off = sVar22 + 2;
            iVar15 = push_signature_algorithms(buf_00);
            if (iVar15 == 0) {
              lVar29 = buf_00->off - (sVar22 + 2);
              buf_00->base[sVar22] = (uint8_t)((ulong)lVar29 >> 8);
              buf_00->base[sVar22 + 1] = (uint8_t)lVar29;
              iVar15 = ptls_buffer_reserve(buf_00,2);
              if (iVar15 == 0) {
                puVar34 = buf_00->base;
                sVar22 = buf_00->off;
                (puVar34 + sVar22)[0] = '\0';
                (puVar34 + sVar22)[1] = '\n';
                buf_00->off = buf_00->off + 2;
                iVar15 = ptls_buffer_reserve(buf_00,2);
                if (iVar15 == 0) {
                  puVar34 = buf_00->base;
                  sVar22 = buf_00->off;
                  (puVar34 + sVar22)[0] = '\0';
                  (puVar34 + sVar22)[1] = '\0';
                  sVar22 = buf_00->off;
                  buf_00->off = sVar22 + 2;
                  pppVar30 = tls->ctx->key_exchanges;
                  iVar15 = ptls_buffer_reserve(buf_00,2);
                  if (iVar15 == 0) {
                    puVar34 = buf_00->base;
                    sVar41 = buf_00->off;
                    (puVar34 + sVar41)[0] = '\0';
                    (puVar34 + sVar41)[1] = '\0';
                    sVar41 = buf_00->off;
                    sVar28 = sVar41 + 2;
                    buf_00->off = sVar28;
                    ppVar10 = *pppVar30;
                    local_d0 = sVar28;
                    while (ppVar10 != (ptls_key_exchange_algorithm_t *)0x0) {
                      pppVar30 = pppVar30 + 1;
                      uVar2 = ppVar10->id;
                      iVar15 = ptls_buffer_reserve(buf_00,2);
                      if (iVar15 != 0) goto LAB_00113a07;
                      *(ushort *)(buf_00->base + buf_00->off) = uVar2 << 8 | uVar2 >> 8;
                      sVar28 = buf_00->off + 2;
                      buf_00->off = sVar28;
                      ppVar10 = *pppVar30;
                    }
                    buf_00->base[sVar41] = (uint8_t)(sVar28 - local_d0 >> 8);
                    buf_00->base[sVar41 + 1] = (uint8_t)(sVar28 - local_d0);
                    lVar29 = buf_00->off - (sVar22 + 2);
                    buf_00->base[sVar22] = (uint8_t)((ulong)lVar29 >> 8);
                    buf_00->base[sVar22 + 1] = (uint8_t)lVar29;
                    if ((local_d8 != (ptls_iovec_t *)0x0) && (local_d8->base != (uint8_t *)0x0)) {
                      iVar15 = ptls_buffer_reserve(buf_00,2);
                      if (iVar15 != 0) goto LAB_00113a07;
                      puVar34 = buf_00->base;
                      sVar22 = buf_00->off;
                      (puVar34 + sVar22)[0] = '\0';
                      (puVar34 + sVar22)[1] = ',';
                      buf_00->off = buf_00->off + 2;
                      iVar15 = ptls_buffer_reserve(buf_00,2);
                      if (iVar15 != 0) goto LAB_00113a07;
                      puVar34 = buf_00->base;
                      sVar22 = buf_00->off;
                      (puVar34 + sVar22)[0] = '\0';
                      (puVar34 + sVar22)[1] = '\0';
                      sVar22 = buf_00->off;
                      buf_00->off = sVar22 + 2;
                      iVar15 = ptls_buffer_reserve(buf_00,2);
                      if (iVar15 != 0) goto LAB_00113a07;
                      puVar34 = buf_00->base;
                      sVar41 = buf_00->off;
                      (puVar34 + sVar41)[0] = '\0';
                      (puVar34 + sVar41)[1] = '\0';
                      sVar41 = buf_00->off;
                      buf_00->off = sVar41 + 2;
                      iVar15 = ptls_buffer__do_pushv(buf_00,local_d8->base,local_d8->len);
                      if (iVar15 != 0) goto LAB_00113a07;
                      lVar29 = buf_00->off - (sVar41 + 2);
                      buf_00->base[sVar41] = (uint8_t)((ulong)lVar29 >> 8);
                      buf_00->base[sVar41 + 1] = (uint8_t)lVar29;
                      lVar29 = buf_00->off - (sVar22 + 2);
                      buf_00->base[sVar22] = (uint8_t)((ulong)lVar29 >> 8);
                      buf_00->base[sVar22 + 1] = (uint8_t)lVar29;
                    }
                    iVar15 = push_additional_extensions(properties,buf_00);
                    if (iVar15 == 0) {
                      if (tls->ctx->save_ticket != (ptls_save_ticket_t *)0x0 ||
                          local_108 != (ushort *)0x0) {
                        iVar15 = ptls_buffer_reserve(buf_00,2);
                        if (iVar15 != 0) goto LAB_00113a07;
                        puVar34 = buf_00->base;
                        sVar22 = buf_00->off;
                        (puVar34 + sVar22)[0] = '\0';
                        (puVar34 + sVar22)[1] = '-';
                        buf_00->off = buf_00->off + 2;
                        iVar15 = ptls_buffer_reserve(buf_00,2);
                        if (iVar15 != 0) goto LAB_00113a07;
                        puVar34 = buf_00->base;
                        sVar22 = buf_00->off;
                        (puVar34 + sVar22)[0] = '\0';
                        (puVar34 + sVar22)[1] = '\0';
                        sVar22 = buf_00->off;
                        buf_00->off = sVar22 + 2;
                        iVar15 = ptls_buffer_reserve(buf_00,1);
                        if (iVar15 != 0) goto LAB_00113a07;
                        buf_00->base[buf_00->off] = '\0';
                        sVar41 = buf_00->off;
                        buf_00->off = sVar41 + 1;
                        if ((tls->ctx->field_0x68 & 1) == 0) {
                          iVar15 = ptls_buffer_reserve(buf_00,1);
                          if (iVar15 != 0) goto LAB_00113a07;
                          buf_00->base[buf_00->off] = '\0';
                          buf_00->off = buf_00->off + 1;
                        }
                        iVar15 = ptls_buffer_reserve(buf_00,1);
                        if (iVar15 != 0) goto LAB_00113a07;
                        buf_00->base[buf_00->off] = '\x01';
                        sVar28 = buf_00->off;
                        buf_00->off = sVar28 + 1;
                        buf_00->base[sVar41] = (char)sVar28 - (char)sVar41;
                        lVar29 = buf_00->off - (sVar22 + 2);
                        buf_00->base[sVar22] = (uint8_t)((ulong)lVar29 >> 8);
                        buf_00->base[sVar22 + 1] = (uint8_t)lVar29;
                        if (local_108 != (ushort *)0x0) {
                          if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) != 0 &&
                              ppVar4 == (ptls_key_schedule_t *)0x0) {
                            iVar15 = ptls_buffer_reserve(buf_00,2);
                            if (iVar15 != 0) goto LAB_00113a07;
                            puVar34 = buf_00->base;
                            sVar22 = buf_00->off;
                            (puVar34 + sVar22)[0] = '\0';
                            (puVar34 + sVar22)[1] = '*';
                            buf_00->off = buf_00->off + 2;
                            iVar15 = ptls_buffer_reserve(buf_00,2);
                            if (iVar15 != 0) goto LAB_00113a07;
                            puVar34 = buf_00->base;
                            sVar22 = buf_00->off;
                            (puVar34 + sVar22)[0] = '\0';
                            (puVar34 + sVar22)[1] = '\0';
                            sVar22 = buf_00->off;
                            buf_00->off = sVar22 + 2;
                            buf_00->base[sVar22] = '\0';
                            buf_00->base[sVar22 + 1] = '\0';
                          }
                          iVar15 = ptls_buffer_reserve(buf_00,2);
                          if (iVar15 != 0) goto LAB_00113a07;
                          puVar34 = buf_00->base;
                          sVar22 = buf_00->off;
                          (puVar34 + sVar22)[0] = '\0';
                          (puVar34 + sVar22)[1] = ')';
                          buf_00->off = buf_00->off + 2;
                          iVar15 = ptls_buffer_reserve(buf_00,2);
                          if (iVar15 != 0) goto LAB_00113a07;
                          puVar34 = buf_00->base;
                          sVar22 = buf_00->off;
                          (puVar34 + sVar22)[0] = '\0';
                          (puVar34 + sVar22)[1] = '\0';
                          sVar22 = buf_00->off;
                          sVar41 = sVar22 + 2;
                          buf_00->off = sVar41;
                          iVar15 = ptls_buffer_reserve(buf_00,2);
                          if (iVar15 != 0) goto LAB_00113a07;
                          puVar34 = buf_00->base;
                          sVar28 = buf_00->off;
                          (puVar34 + sVar28)[0] = '\0';
                          (puVar34 + sVar28)[1] = '\0';
                          sVar28 = buf_00->off;
                          buf_00->off = sVar28 + 2;
                          iVar15 = ptls_buffer_reserve(buf_00,2);
                          if (iVar15 != 0) goto LAB_00113a07;
                          puVar34 = buf_00->base;
                          sVar26 = buf_00->off;
                          (puVar34 + sVar26)[0] = '\0';
                          (puVar34 + sVar26)[1] = '\0';
                          sVar26 = buf_00->off;
                          buf_00->off = sVar26 + 2;
                          iVar15 = ptls_buffer__do_pushv
                                             (buf_00,resumption_ticket.base,resumption_ticket.len);
                          if (iVar15 != 0) goto LAB_00113a07;
                          lVar29 = buf_00->off - (sVar26 + 2);
                          buf_00->base[sVar26] = (uint8_t)((ulong)lVar29 >> 8);
                          buf_00->base[sVar26 + 1] = (uint8_t)lVar29;
                          iVar15 = ptls_buffer_reserve(buf_00,4);
                          if (iVar15 != 0) goto LAB_00113a07;
                          *(uint *)(buf_00->base + buf_00->off) =
                               uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                               uVar16 << 0x18;
                          sVar26 = buf_00->off + 4;
                          buf_00->off = sVar26;
                          lVar29 = sVar26 - (sVar28 + 2);
                          buf_00->base[sVar28] = (uint8_t)((ulong)lVar29 >> 8);
                          buf_00->base[sVar28 + 1] = (uint8_t)lVar29;
                          iVar15 = ptls_buffer_reserve(buf_00,2);
                          if (iVar15 != 0) goto LAB_00113a07;
                          puVar34 = buf_00->base;
                          sVar28 = buf_00->off;
                          (puVar34 + sVar28)[0] = '\0';
                          (puVar34 + sVar28)[1] = '\0';
                          sVar28 = buf_00->off;
                          buf_00->off = sVar28 + 2;
                          iVar15 = ptls_buffer_reserve(buf_00,1);
                          if (iVar15 != 0) goto LAB_00113a07;
                          buf_00->base[buf_00->off] = '\0';
                          sVar26 = buf_00->off;
                          sVar43 = sVar26 + 1;
                          buf_00->off = sVar43;
                          iVar15 = ptls_buffer_reserve(buf_00,(tls->key_schedule->hashes[0].algo)->
                                                              digest_size);
                          if (iVar15 != 0) goto LAB_00113a07;
                          sVar32 = buf_00->off + (tls->key_schedule->hashes[0].algo)->digest_size;
                          buf_00->off = sVar32;
                          buf_00->base[sVar26] = (char)sVar32 - (char)sVar43;
                          lVar29 = buf_00->off - (sVar28 + 2);
                          buf_00->base[sVar28] = (uint8_t)((ulong)lVar29 >> 8);
                          buf_00->base[sVar28 + 1] = (uint8_t)lVar29;
                          lVar29 = buf_00->off - sVar41;
                          buf_00->base[sVar22] = (uint8_t)((ulong)lVar29 >> 8);
                          buf_00->base[sVar22 + 1] = (uint8_t)lVar29;
                        }
                      }
                      lVar29 = buf_00->off - local_b8;
                      buf_00->base[local_b0] = (uint8_t)((ulong)lVar29 >> 8);
                      buf_00->base[local_b0 + 1] = (uint8_t)lVar29;
                      sVar22 = buf->off;
                      lVar29 = 0x10;
                      do {
                        buf->base[(long)local_c8] =
                             (uint8_t)(sVar22 - (long)local_a8 >> ((byte)lVar29 & 0x3f));
                        lVar29 = lVar29 + -8;
                        local_c8 = (ptls_cipher_suite_t **)((long)local_c8 + 1);
                      } while (lVar29 != -8);
                      iVar15 = (*emitter->commit_message)(emitter);
                      if (iVar15 == 0) {
                        local_120 = lVar33;
                        if (local_108 != (ushort *)0x0) {
                          sVar22 = emitter->buf->off;
                          ppVar23 = tls->key_schedule;
                          algo = ppVar23->hashes[0].algo;
                          sVar41 = algo->digest_size;
                          hash_value.len = sVar41;
                          hash_value.base = algo->empty_digest;
                          secret.len = sVar41;
                          secret.base = ppVar23->secret;
                          iVar15 = hkdf_expand_label(algo,binder_key,sVar41,secret,"res binder",
                                                     hash_value,ppVar23->hkdf_label_prefix);
                          if (iVar15 != 0) goto LAB_00113a07;
                          lVar29 = sVar22 - sVar41;
                          local_120 = lVar29 + -3;
                          ppVar23 = tls->key_schedule;
                          puVar34 = emitter->buf->base;
                          if (ppVar23->num_hashes != 0) {
                            pppVar37 = &ppVar23->hashes[0].ctx;
                            sVar22 = 0;
                            do {
                              (*(*pppVar37)->update)(*pppVar37,puVar34 + lVar33,local_120 - lVar33);
                              sVar22 = sVar22 + 1;
                              pppVar37 = pppVar37 + 2;
                            } while (sVar22 != ppVar23->num_hashes);
                            puVar34 = emitter->buf->base;
                            ppVar23 = tls->key_schedule;
                          }
                          iVar15 = calc_verify_data(puVar34 + lVar29,ppVar23,binder_key);
                          if (iVar15 != 0) goto LAB_00113a07;
                        }
                        ppVar23 = tls->key_schedule;
                        if (ppVar23->num_hashes != 0) {
                          puVar34 = emitter->buf->base;
                          sVar22 = emitter->buf->off;
                          pppVar37 = &ppVar23->hashes[0].ctx;
                          sVar41 = 0;
                          do {
                            (*(*pppVar37)->update)(*pppVar37,puVar34 + local_120,sVar22 - local_120)
                            ;
                            sVar41 = sVar41 + 1;
                            pppVar37 = pppVar37 + 2;
                          } while (sVar41 != ppVar23->num_hashes);
                        }
                        if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) != 0) {
                          if (ppVar4 != (ptls_key_schedule_t *)0x0) {
                            __assert_fail("!is_second_flight",
                                          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                                          ,0x7e2,
                                          "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                                         );
                          }
                          iVar15 = setup_traffic_protection(tls,1,"c e traffic",1,0);
                          if ((iVar15 != 0) ||
                             (iVar15 = push_change_cipher_spec(tls,emitter->buf), iVar15 != 0))
                          goto LAB_00113a07;
                        }
                        if ((ppVar4 != (ptls_key_schedule_t *)0x0 || local_108 == (ushort *)0x0) ||
                           (iVar15 = derive_exporter_secret(tls,1), iVar15 == 0)) {
                          tls->state = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO -
                                       (local_d8 == (ptls_iovec_t *)0x0);
                          iVar15 = 0x202;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00113a07:
  (*ptls_clear_memory)(binder_key,0x40);
  return iVar15;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    ptls_iovec_t resumption_secret = {NULL}, resumption_ticket;
    uint32_t obfuscated_ticket_age = 0;
    size_t msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret, is_second_flight = tls->key_schedule != NULL,
             send_sni = tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name);

    if (properties != NULL) {
        /* try to use ESNI */
        if (!is_second_flight && send_sni && properties->client.esni_keys.base != NULL) {
            if ((ret = client_setup_esni(tls->ctx, &tls->esni, properties->client.esni_keys, tls->client_random)) != 0)
                goto Exit;
            if (tls->ctx->update_esni_key != NULL) {
                if ((ret = tls->ctx->update_esni_key->cb(tls->ctx->update_esni_key, tls, tls->esni->secret,
                                                         tls->esni->client.cipher->hash, tls->esni->esni_contents_hash)) != 0)
                    goto Exit;
            }
        }
        /* setup resumption-related data. If successful, resumption_secret becomes a non-zero value. */
        if (properties->client.session_ticket.base != NULL) {
            ptls_key_exchange_algorithm_t *key_share = NULL;
            ptls_cipher_suite_t *cipher_suite = NULL;
            uint32_t max_early_data_size;
            if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &resumption_secret, &obfuscated_ticket_age,
                                             &resumption_ticket, &max_early_data_size, properties->client.session_ticket.base,
                                             properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
                tls->client.offered_psk = 1;
                /* key-share selected by HRR should not be overridden */
                if (tls->key_share == NULL)
                    tls->key_share = key_share;
                tls->cipher_suite = cipher_suite;
                if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                    tls->client.using_early_data = 1;
                    *properties->client.max_early_data_size = max_early_data_size;
                }
            } else {
                resumption_secret = ptls_iovec_init(NULL, 0);
            }
        }
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    if (!is_second_flight) {
        tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ctx->hkdf_label_prefix__obsolete);
        if ((ret = key_schedule_extract(tls->key_schedule, resumption_secret)) != 0)
            goto Exit;
    }

    msghash_off = emitter->buf->off + emitter->record_header_length;
    ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        ptls_buffer_t *sendbuf = emitter->buf;
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, tls->client_random, sizeof(tls->client_random));
        /* lecagy_session_id */
        ptls_buffer_push_block(
            sendbuf, 1, { ptls_buffer_pushv(sendbuf, tls->client.legacy_session_id, sizeof(tls->client.legacy_session_id)); });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = tls->ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            struct {
                size_t off;
                size_t len;
            } key_share_client_hello;
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                key_share_client_hello.off = sendbuf->off;
                ptls_buffer_push_block(sendbuf, 2, {
                    if (tls->key_share != NULL) {
                        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
                            goto Exit;
                        if ((ret = push_key_share_entry(sendbuf, tls->key_share->id, tls->client.key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    }
                });
                key_share_client_hello.len = sendbuf->off - key_share_client_hello.off;
            });
            if (send_sni) {
                if (tls->esni != NULL) {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME, {
                        if ((ret = emit_esni_extension(tls->esni, sendbuf, properties->client.esni_keys, tls->server_name,
                                                       key_share_client_hello.off, key_share_client_hello.len)) != 0)
                            goto Exit;
                    });
                } else {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                        if ((ret = emit_server_name_extension(sendbuf, tls->server_name)) != 0)
                            goto Exit;
                    });
                }
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (tls->ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = tls->ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != sizeof(supported_versions) / sizeof(supported_versions[0]); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(sendbuf)) != 0)
                    goto Exit;
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                ptls_key_exchange_algorithm_t **algo = tls->ctx->key_exchanges;
                ptls_buffer_push_block(sendbuf, 2, {
                    for (; *algo != NULL; ++algo)
                        ptls_buffer_push16(sendbuf, (*algo)->id);
                });
            });
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (tls->ctx->save_ticket != NULL || resumption_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!tls->ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (resumption_secret.base != NULL) {
                if (tls->client.using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2,
                                               { ptls_buffer_pushv(sendbuf, resumption_ticket.base, resumption_ticket.len); });
                        ptls_buffer_push32(sendbuf, obfuscated_ticket_age);
                    });
                    /* allocate space for PSK binder. the space is filled at the bottom of the function */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                                goto Exit;
                            sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
                        });
                    });
                });
            }
        });
    });

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (resumption_secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, "res binder")) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off);

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter->buf)) != 0)
            goto Exit;
    }
    if (resumption_secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}